

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int ncnn::gemm_AT_BT_x86
              (Mat *AT,Mat *BT,Mat *C,Mat *top_blob,int broadcast_type_C,int M,int N,int K,
              int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
              int nT,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000038;
  bool k_end;
  Mat BT_tile;
  Mat AT_tile;
  int max_kk;
  int k;
  Mat *CT_tile;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int i;
  int ppi;
  Mat topT;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int in_stack_00003f00;
  int in_stack_00003f08;
  int in_stack_00003f10;
  int in_stack_00003f18;
  int in_stack_00003f20;
  int in_stack_00003f28;
  undefined4 in_stack_fffffffffffff814;
  undefined4 in_stack_fffffffffffff818;
  undefined4 in_stack_fffffffffffff81c;
  int in_stack_fffffffffffff824;
  int in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  Mat *in_stack_fffffffffffff830;
  undefined8 in_stack_fffffffffffff870;
  void **ppvVar2;
  int in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  undefined8 in_stack_fffffffffffff880;
  int *in_stack_fffffffffffff890;
  int *in_stack_fffffffffffff898;
  Mat *in_stack_fffffffffffff8a0;
  Mat *in_stack_fffffffffffff8a8;
  void **in_stack_fffffffffffff8b0;
  undefined8 in_stack_fffffffffffff8b8;
  Mat *in_stack_fffffffffffff8c0;
  Mat *in_stack_fffffffffffff8c8;
  void **local_730;
  int local_6b8 [8];
  Allocator *local_698;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined4 local_680;
  undefined8 local_678;
  void *local_670;
  int *local_668;
  size_t local_660;
  int local_658;
  Allocator *local_650;
  undefined4 local_648;
  int local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  long local_630;
  Mat local_628;
  void *local_5e0;
  int *local_5d8;
  size_t local_5d0;
  int local_5c8;
  Allocator *local_5c0;
  undefined4 local_5b8;
  int local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  long local_5a0;
  int local_594;
  int local_590;
  int local_58c;
  void **local_588;
  int local_57c;
  int local_578;
  int local_574;
  void *local_570;
  int *local_568;
  ulong local_560;
  undefined4 local_558;
  long *local_550;
  int local_548;
  int local_544;
  int local_540;
  undefined4 local_53c;
  undefined4 local_538;
  ulong local_530;
  void *local_528;
  int *local_520;
  void *local_518;
  undefined4 local_510;
  long *local_508;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  void *local_4e8;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  undefined4 local_4d0;
  void *local_4c0;
  int *local_4b8;
  ulong local_4b0;
  undefined4 local_4a8;
  long *local_4a0;
  int local_498;
  int local_494;
  int local_490;
  undefined4 local_48c;
  int local_488;
  long local_480;
  int local_478;
  int local_474;
  int local_470;
  int local_46c;
  int local_468;
  int local_464;
  void **local_458;
  Mat *local_450;
  Mat *local_448;
  int local_43c;
  void **local_438;
  void **local_430;
  void **local_428;
  Mat *local_418;
  int *local_408;
  void **local_3f8;
  void **local_3e8;
  void **local_3d8;
  void **local_3c8;
  void **local_3b8;
  undefined1 local_3ad;
  int local_3ac;
  void **local_3a8;
  void **local_3a0;
  int local_370;
  undefined4 local_36c;
  void **local_368;
  int local_350;
  undefined4 local_34c;
  void **local_348;
  int local_330;
  undefined4 local_32c;
  void **local_328;
  int local_310;
  undefined4 local_30c;
  void **local_308;
  int *local_2e8;
  Mat *local_2c8;
  int local_2b0;
  undefined4 local_2ac;
  void **local_2a8;
  void **local_298;
  void **local_290;
  void **local_288;
  int local_280;
  undefined4 local_27c;
  void **local_278;
  void **local_270;
  long *local_268;
  undefined4 local_25c;
  ulong local_258;
  void *local_250;
  undefined4 local_244;
  int local_240;
  int local_23c;
  void **local_238;
  undefined4 local_22c;
  long local_228;
  void *local_220;
  void *local_218;
  void *local_1e8;
  void *local_1d8;
  void *local_1c8;
  void *local_1b8;
  undefined1 local_19d;
  int local_19c;
  int *local_190;
  Allocator *local_170;
  int local_164;
  size_t local_160;
  void *local_158;
  int local_14c;
  int local_148;
  int local_144;
  int *local_140;
  undefined4 local_134;
  long local_130;
  undefined1 local_11d;
  int local_11c;
  Mat *local_110;
  Allocator *local_f0;
  int local_e4;
  size_t local_e0;
  void *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  Mat *local_c0;
  undefined4 local_b4;
  long local_b0;
  undefined4 local_a0;
  int local_9c;
  int *local_98;
  void **local_90;
  Allocator *local_88;
  int local_7c;
  size_t local_78;
  void *local_70;
  undefined4 local_68;
  int local_64;
  void **local_60;
  undefined4 local_58;
  int local_54;
  Mat *local_50;
  void **local_48;
  Allocator *local_40;
  int local_34;
  size_t local_30;
  void *local_28;
  undefined4 local_20;
  int local_1c;
  void **local_18;
  
  local_468 = in_R9D;
  local_464 = in_R8D;
  local_458 = in_RDX;
  local_450 = in_RSI;
  local_448 = in_RDI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff880 >> 0x20),(int)in_stack_fffffffffffff880,
             in_stack_fffffffffffff87c,in_stack_fffffffffffff878,
             (int)((ulong)in_stack_fffffffffffff870 >> 0x20),(int)in_stack_fffffffffffff870,
             in_stack_fffffffffffff890,in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff8a0,
             (int)in_stack_fffffffffffff8a8);
  local_478 = (local_468 + local_46c + -1) / local_46c;
  local_438 = &local_4c0;
  local_4c0 = (void *)0x0;
  local_4b8 = (int *)0x0;
  local_4b0 = 0;
  local_4a8 = 0;
  local_4a0 = (long *)0x0;
  local_498 = 0;
  local_494 = 0;
  local_490 = 0;
  local_48c = 0;
  local_488 = 0;
  local_480 = 0;
  if (((local_474 < in_stack_00000010) || (local_464 == 3)) || (in_stack_00000018 != 0)) {
    Mat::create(in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff828,
                in_stack_fffffffffffff824,
                CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),
                (Allocator *)CONCAT44(in_stack_fffffffffffff814,in_stack_00000038));
    local_3b8 = &local_4c0;
    if (local_4c0 != (void *)0x0) {
      local_270 = local_3b8;
    }
    if (local_4c0 == (void *)0x0 || local_480 * local_488 == 0) {
      local_43c = -100;
      goto LAB_01847ef3;
    }
  }
  for (local_4d4 = 0; local_4d4 < local_478; local_4d4 = local_4d4 + 1) {
    local_4d8 = local_4d4 * local_46c;
    local_4e0 = local_468 - local_4d8;
    piVar1 = std::min<int>(&local_4e0,&local_46c);
    local_4dc = *piVar1;
    local_430 = &local_528;
    local_528 = (void *)0x0;
    local_520 = (int *)0x0;
    local_518 = (void *)0x0;
    local_510 = 0;
    local_508 = (long *)0x0;
    local_500 = 0;
    local_4fc = 0;
    local_4f8 = 0;
    local_4f4 = 0;
    local_4f0 = 0;
    local_4e8 = (void *)0x0;
    if (((local_474 < in_stack_00000010) || (local_464 == 3)) || (in_stack_00000018 != 0)) {
      local_3ac = get_omp_thread_num();
      local_3a0 = &local_570;
      local_3a8 = &local_4c0;
      local_250 = (void *)((long)local_4c0 + local_480 * local_3ac * local_4b0);
      local_238 = &local_570;
      local_570 = local_250;
      local_568 = (int *)0x0;
      local_560 = local_4b0;
      local_558 = local_4a8;
      local_550 = local_4a0;
      local_544 = local_494;
      local_540 = local_490;
      local_53c = 1;
      local_538 = local_48c;
      local_228 = (long)local_494 * (long)local_490 * local_4b0;
      local_530 = (local_228 + 0xfU & 0xfffffffffffffff0) / local_4b0;
      local_548 = local_498 + -1;
      if (local_498 == 4) {
        local_530 = (long)local_494 * (long)local_490;
      }
      local_22c = 0x10;
      local_23c = local_494;
      local_240 = local_490;
      local_244 = local_48c;
      local_258 = local_4b0;
      local_25c = local_4a8;
      local_268 = local_4a0;
      local_3ad = 1;
      local_298 = &local_570;
      local_290 = &local_528;
      if (&local_528 != local_298) {
        local_278 = &local_528;
        if (local_520 != (int *)0x0) {
          local_27c = 0xffffffff;
          LOCK();
          local_280 = *local_520;
          *local_520 = *local_520 + -1;
          UNLOCK();
          if (local_280 == 1) {
            if (local_508 == (long *)0x0) {
              local_220 = local_528;
              if (local_528 != (void *)0x0) {
                free(local_528);
              }
            }
            else {
              (**(code **)(*local_508 + 0x18))(local_508,local_528);
            }
          }
        }
        local_528 = (void *)0x0;
        local_518 = (void *)0x0;
        local_510 = 0;
        local_500 = 0;
        local_4fc = 0;
        local_4f8 = 0;
        local_4f4 = 0;
        local_4f0 = 0;
        local_4e8 = (void *)0x0;
        local_520 = (int *)0x0;
        local_528 = *local_298;
        local_520 = (int *)local_298[1];
        local_518 = local_298[2];
        local_510 = *(undefined4 *)(local_298 + 3);
        local_508 = (long *)local_298[4];
        local_500 = *(undefined4 *)(local_298 + 5);
        local_4fc = *(undefined4 *)((long)local_298 + 0x2c);
        local_4f8 = *(undefined4 *)(local_298 + 6);
        local_4f4 = *(undefined4 *)((long)local_298 + 0x34);
        local_4f0 = *(undefined4 *)(local_298 + 7);
        local_4e8 = local_298[8];
      }
      local_428 = &local_570;
      local_2a8 = local_428;
      local_288 = &local_528;
      if (local_568 != (int *)0x0) {
        local_2ac = 0xffffffff;
        LOCK();
        local_2b0 = *local_568;
        *local_568 = *local_568 + -1;
        UNLOCK();
        if (local_2b0 == 1) {
          if (local_550 == (long *)0x0) {
            local_218 = local_570;
            if (local_570 != (void *)0x0) {
              free(local_570);
            }
          }
          else {
            (**(code **)(*local_550 + 0x18))(local_550,local_570);
          }
        }
      }
      local_570 = (void *)0x0;
      local_560 = 0;
      local_558 = 0;
      local_548 = 0;
      local_544 = 0;
      local_540 = 0;
      local_53c = 0;
      local_538 = 0;
      local_530 = 0;
      local_568 = (int *)0x0;
    }
    for (local_574 = 0; local_574 < in_stack_00000008; local_574 = local_470 + local_574) {
      local_57c = in_stack_00000008 - local_574;
      piVar1 = std::min<int>(&local_57c,&local_470);
      local_578 = *piVar1;
      if (local_464 == 3) {
        pack_A_tile(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                    (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
                    (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20),(int)in_stack_fffffffffffff8b0);
      }
      if (local_464 == 3) {
        local_730 = &local_528;
      }
      else {
        local_730 = local_458;
      }
      local_588 = local_730;
      for (local_58c = 0; local_58c < in_stack_00000010; local_58c = local_474 + local_58c) {
        local_594 = in_stack_00000010 - local_58c;
        piVar1 = std::min<int>(&local_594,&local_474);
        local_590 = *piVar1;
        local_11c = local_4d8 / local_46c;
        local_110 = &local_628;
        local_c4 = local_448->w;
        local_c8 = local_448->h;
        local_cc = local_448->d;
        local_d8 = (void *)((long)local_448->data +
                           local_448->cstep * (long)local_11c * local_448->elemsize);
        local_e0 = local_448->elemsize;
        local_e4 = local_448->elempack;
        local_f0 = local_448->allocator;
        in_stack_fffffffffffff8c0 = &local_628;
        local_b0 = (long)local_c4 * (long)local_c8 * local_e0;
        local_54 = local_58c / local_474;
        local_48 = &local_5e0;
        local_50 = &local_628;
        local_28 = (void *)((long)local_d8 + (long)local_c4 * (long)local_54 * local_e0);
        in_stack_fffffffffffff8b0 = &local_5e0;
        local_5a0 = (long)local_c4;
        in_stack_fffffffffffff8a8 = &local_628;
        local_19c = local_574 / local_470;
        local_190 = local_6b8;
        local_144 = local_450->w;
        local_148 = local_450->h;
        local_14c = local_450->d;
        local_158 = (void *)((long)local_450->data +
                            local_450->cstep * (long)local_19c * local_450->elemsize);
        local_160 = local_450->elemsize;
        local_164 = local_450->elempack;
        local_170 = local_450->allocator;
        in_stack_fffffffffffff898 = local_6b8;
        local_130 = (long)local_144 * (long)local_148 * local_160;
        local_9c = local_58c / local_474;
        local_90 = &local_670;
        local_98 = local_6b8;
        local_70 = (void *)((long)local_158 + (long)local_144 * (long)local_9c * local_160);
        local_60 = &local_670;
        local_630 = (long)local_144;
        local_408 = local_6b8;
        local_5a8 = 1;
        local_5ac = 1;
        local_5b0 = 1;
        local_5b8 = 2;
        local_5d8 = (int *)0x0;
        local_628.c = 0;
        local_628.d = 0;
        local_628.h = 0;
        local_628.w = 0;
        local_628.elempack = 0;
        local_628.elemsize = 0;
        local_628.refcount = (int *)0x0;
        local_628.data = (void *)0x0;
        local_638 = 1;
        local_63c = 1;
        local_640 = 1;
        local_648 = 2;
        local_668 = (int *)0x0;
        local_20 = 1;
        local_58 = 1;
        local_68 = 1;
        local_a0 = 1;
        local_b4 = 0x10;
        local_11d = 1;
        local_134 = 0x10;
        local_19d = 1;
        local_628.cstep = 0;
        local_628.dims = 0;
        local_6b8[0] = 0;
        local_6b8[1] = 0;
        local_6b8[4] = 0;
        local_6b8[5] = 0;
        local_6b8[6] = 0;
        local_690 = 0;
        local_68c = 0;
        local_688 = 0;
        local_684 = 0;
        local_680 = 0;
        local_678 = 0;
        local_6b8[2] = 0;
        local_6b8[3] = 0;
        in_stack_fffffffffffff8a0 = local_450;
        in_stack_fffffffffffff8c8 = local_448;
        local_418 = in_stack_fffffffffffff8a8;
        local_2e8 = local_408;
        local_2c8 = in_stack_fffffffffffff8a8;
        local_140 = in_stack_fffffffffffff898;
        local_c0 = in_stack_fffffffffffff8c0;
        local_88 = local_170;
        local_7c = local_164;
        local_78 = local_160;
        local_64 = local_144;
        local_40 = local_f0;
        local_34 = local_e4;
        local_30 = local_e0;
        local_1c = local_c4;
        local_18 = in_stack_fffffffffffff8b0;
        local_698 = local_170;
        local_670 = local_70;
        local_660 = local_160;
        local_658 = local_164;
        local_650 = local_170;
        local_644 = local_144;
        local_628.allocator = local_f0;
        local_5e0 = local_28;
        local_5d0 = local_e0;
        local_5c8 = local_e4;
        local_5c0 = local_f0;
        local_5b4 = local_c4;
        gemm_transB_packed_tile
                  ((Mat *)topT._40_8_,(Mat *)topT.allocator,(Mat *)topT._24_8_,(Mat *)topT.elemsize,
                   (Mat *)topT.refcount,topT.data._4_4_,in_stack_00003f00,in_stack_00003f08,
                   in_stack_00003f10,in_stack_00003f18,in_stack_00003f20,in_stack_00003f28,
                   topT.data._3_1_);
        ppvVar2 = &local_670;
        local_3f8 = ppvVar2;
        local_308 = ppvVar2;
        if (local_668 != (int *)0x0) {
          local_30c = 0xffffffff;
          LOCK();
          local_310 = *local_668;
          *local_668 = *local_668 + -1;
          UNLOCK();
          if (local_310 == 1) {
            if (local_650 == (Allocator *)0x0) {
              local_1e8 = local_670;
              if (local_670 != (void *)0x0) {
                free(local_670);
              }
            }
            else {
              (*local_650->_vptr_Allocator[3])(local_650,local_670);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
        local_3e8 = &local_5e0;
        local_328 = local_3e8;
        if (local_5d8 != (int *)0x0) {
          local_32c = 0xffffffff;
          LOCK();
          local_330 = *local_5d8;
          *local_5d8 = *local_5d8 + -1;
          UNLOCK();
          if (local_330 == 1) {
            if (local_5c0 == (Allocator *)0x0) {
              local_1d8 = local_5e0;
              if (local_5e0 != (void *)0x0) {
                free(local_5e0);
              }
            }
            else {
              (*local_5c0->_vptr_Allocator[3])(local_5c0,local_5e0);
            }
          }
        }
        local_5e0 = (void *)0x0;
        local_5d0 = 0;
        local_5c8 = 0;
        local_5b8 = 0;
        local_5b4 = 0;
        local_5b0 = 0;
        local_5ac = 0;
        local_5a8 = 0;
        local_5a0 = 0;
        local_5d8 = (int *)0x0;
      }
      if (in_stack_00000018 != 0) {
        transpose_unpack_output_tile
                  (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                   (int)((ulong)in_stack_fffffffffffff898 >> 0x20),(int)in_stack_fffffffffffff898,
                   (int)((ulong)in_stack_fffffffffffff890 >> 0x20),(int)in_stack_fffffffffffff890);
      }
    }
    local_3d8 = &local_528;
    local_348 = local_3d8;
    if (local_520 != (int *)0x0) {
      local_34c = 0xffffffff;
      LOCK();
      local_350 = *local_520;
      *local_520 = *local_520 + -1;
      UNLOCK();
      if (local_350 == 1) {
        if (local_508 == (long *)0x0) {
          local_1c8 = local_528;
          if (local_528 != (void *)0x0) {
            free(local_528);
          }
        }
        else {
          (**(code **)(*local_508 + 0x18))(local_508,local_528);
        }
      }
    }
    local_528 = (void *)0x0;
    local_518 = (void *)0x0;
    local_510 = 0;
    local_500 = 0;
    local_4fc = 0;
    local_4f8 = 0;
    local_4f4 = 0;
    local_4f0 = 0;
    local_4e8 = (void *)0x0;
    local_520 = (int *)0x0;
  }
  local_43c = 0;
LAB_01847ef3:
  local_4d0 = 1;
  local_3c8 = &local_4c0;
  if (local_4b8 != (int *)0x0) {
    local_36c = 0xffffffff;
    LOCK();
    local_370 = *local_4b8;
    *local_4b8 = *local_4b8 + -1;
    UNLOCK();
    if (local_370 == 1) {
      local_368 = local_3c8;
      if (local_4a0 == (long *)0x0) {
        local_1b8 = local_4c0;
        if (local_4c0 != (void *)0x0) {
          free(local_4c0);
        }
      }
      else {
        (**(code **)(*local_4a0 + 0x18))(local_4a0,local_4c0);
      }
    }
  }
  return local_43c;
}

Assistant:

static int gemm_AT_BT_x86(const Mat& AT, const Mat& BT, const Mat& C, Mat& top_blob, int broadcast_type_C, int M, int N, int K, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}